

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int buffer_read_fn(spng_ctx *ctx,void *user,void *data,size_t n)

{
  if (ctx->bytes_left < n) {
    return -1;
  }
  ctx->data = ctx->data + ctx->last_read_size;
  ctx->last_read_size = n;
  ctx->bytes_left = ctx->bytes_left - n;
  return 0;
}

Assistant:

static int buffer_read_fn(spng_ctx *ctx, void *user, void *data, size_t n)
{
    if(n > ctx->bytes_left) return SPNG_IO_EOF;

    (void)user;
    (void)data;
    ctx->data = ctx->data + ctx->last_read_size;

    ctx->last_read_size = n;
    ctx->bytes_left -= n;

    return 0;
}